

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

uint __thiscall
crnlib::dxt1_endpoint_optimizer::color_distance
          (dxt1_endpoint_optimizer *this,bool perceptual,color_quad_u8 *e1,color_quad_u8 *e2,
          bool alpha)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,perceptual) != 0) {
    uVar1 = crnlib::color::color_distance(true,e1,e2,alpha);
    return uVar1;
  }
  if (this->m_pParams->m_grayscale_sampling == true) {
    iVar2 = crnlib::color::RGB_to_Y(e1);
    iVar3 = crnlib::color::RGB_to_Y(e2);
    iVar2 = iVar2 - iVar3;
    if (alpha) {
      iVar3 = (uint)(e1->field_0).field_0.a - (uint)(e2->field_0).field_0.a;
      uVar1 = iVar3 * iVar3 + iVar2 * iVar2;
    }
    else {
      uVar1 = iVar2 * iVar2;
    }
    return uVar1;
  }
  uVar1 = crnlib::color::elucidian_distance(e1,e2,alpha);
  return uVar1;
}

Assistant:

inline uint dxt1_endpoint_optimizer::color_distance(bool perceptual, const color_quad_u8& e1, const color_quad_u8& e2, bool alpha)
    {
        if (perceptual)
        {
            return color::color_distance(true, e1, e2, alpha);
        }
        else if (m_pParams->m_grayscale_sampling)
        {
            // Computes error assuming shader will be converting the result to grayscale.
            int y0 = color::RGB_to_Y(e1);
            int y1 = color::RGB_to_Y(e2);
            int yd = y0 - y1;
            if (alpha)
            {
                int da = (int)e1[3] - (int)e2[3];
                return yd * yd + da * da;
            }
            else
            {
                return yd * yd;
            }
        }
        else
        {
            return color::color_distance(false, e1, e2, alpha);
        }
    }